

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pTextureFilteringTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Performance::TextureFilteringTests::init(TextureFilteringTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  deUint32 internalFormat;
  TestNode *this_00;
  float *pfVar2;
  long *plVar3;
  Texture2DRenderCase *this_01;
  int row_2;
  long lVar4;
  long *plVar5;
  int row;
  long lVar6;
  long lVar7;
  Mat3 *coordTransform;
  bool bVar8;
  float fVar9;
  undefined4 uVar10;
  allocator<char> local_129;
  Matrix<float,_3,_3> local_128;
  Matrix<float,_3,_3> res_1;
  long *local_c8;
  undefined4 local_c0;
  long local_b8 [2];
  long local_a8;
  TestNode *local_a0;
  ulong local_98;
  ulong local_90;
  char *local_88;
  char *local_80;
  Mat3 magTransform;
  Mat3 minTransform;
  
  pfVar2 = (float *)&magTransform;
  magTransform.m_data.m_data[1].m_data[1] = 0.0;
  magTransform.m_data.m_data[1].m_data[2] = 0.0;
  magTransform.m_data.m_data[0].m_data[0] = 0.0;
  magTransform.m_data.m_data[0].m_data[1] = 0.0;
  magTransform.m_data.m_data[0].m_data[2] = 0.0;
  magTransform.m_data.m_data[1].m_data[0] = 0.0;
  magTransform.m_data.m_data[2].m_data[2] = 0.0;
  lVar4 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar10 = 0x3f800000;
      if (lVar4 != lVar7) {
        uVar10 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar7) = uVar10;
      lVar7 = lVar7 + 0xc;
    } while (lVar7 != 0x24);
    lVar6 = lVar6 + 1;
    pfVar2 = pfVar2 + 1;
    lVar4 = lVar4 + 0xc;
  } while (lVar6 != 3);
  magTransform.m_data.m_data[2].m_data[0] = -0.3;
  magTransform.m_data.m_data[2].m_data[1] = -0.6;
  local_128.m_data.m_data[0].m_data[0] = 1.7;
  local_128.m_data.m_data[0].m_data[1] = 2.3;
  local_128.m_data.m_data[0].m_data[2] = 1.0;
  pfVar2 = (float *)&res_1;
  res_1.m_data.m_data[0].m_data[0] = 0.0;
  res_1.m_data.m_data[0].m_data[1] = 0.0;
  res_1.m_data.m_data[0].m_data[2] = 0.0;
  res_1.m_data.m_data[1].m_data[0] = 0.0;
  res_1.m_data.m_data[1].m_data[1] = 0.0;
  res_1.m_data.m_data[1].m_data[2] = 0.0;
  res_1.m_data.m_data[2].m_data[0] = 0.0;
  res_1.m_data.m_data[2].m_data[1] = 0.0;
  res_1.m_data.m_data[2].m_data[2] = 0.0;
  lVar4 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      fVar9 = 0.0;
      if (lVar4 == lVar7) {
        fVar9 = local_128.m_data.m_data[0].m_data[lVar6];
      }
      *(float *)((long)pfVar2 + lVar7) = fVar9;
      lVar7 = lVar7 + 0xc;
    } while (lVar7 != 0x24);
    lVar6 = lVar6 + 1;
    pfVar2 = pfVar2 + 1;
    lVar4 = lVar4 + 0xc;
  } while (lVar6 != 3);
  pfVar2 = (float *)&res_1;
  tcu::operator*(&minTransform,&magTransform,(Matrix<float,_3,_3> *)pfVar2);
  res_1.m_data.m_data[1].m_data[1] = 0.0;
  res_1.m_data.m_data[1].m_data[2] = 0.0;
  res_1.m_data.m_data[0].m_data[0] = 0.0;
  res_1.m_data.m_data[0].m_data[1] = 0.0;
  res_1.m_data.m_data[0].m_data[2] = 0.0;
  res_1.m_data.m_data[1].m_data[0] = 0.0;
  res_1.m_data.m_data[2].m_data[2] = 0.0;
  lVar4 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar10 = 0x3f800000;
      if (lVar4 != lVar7) {
        uVar10 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar7) = uVar10;
      lVar7 = lVar7 + 0xc;
    } while (lVar7 != 0x24);
    lVar6 = lVar6 + 1;
    pfVar2 = pfVar2 + 1;
    lVar4 = lVar4 + 0xc;
  } while (lVar6 != 3);
  res_1.m_data.m_data[2].m_data[0] = 0.3;
  res_1.m_data.m_data[2].m_data[1] = 0.4;
  local_c8 = (long *)0x3e4ccccd3e99999a;
  local_c0 = 0x3f800000;
  pfVar2 = (float *)&local_128;
  local_128.m_data.m_data[0].m_data._0_8_ = (float *)0x0;
  local_128.m_data.m_data[0].m_data[2] = 0.0;
  local_128.m_data.m_data[1].m_data[0] = 0.0;
  local_128.m_data.m_data[1].m_data[1] = 0.0;
  local_128.m_data.m_data[1].m_data[2] = 0.0;
  local_128.m_data.m_data[2].m_data[0] = 0.0;
  local_128.m_data.m_data[2].m_data[1] = 0.0;
  local_128.m_data.m_data[2].m_data[2] = 0.0;
  lVar4 = 0;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      uVar10 = 0;
      if (lVar4 == lVar7) {
        uVar10 = *(undefined4 *)((long)&local_c8 + lVar6 * 4);
      }
      *(undefined4 *)((long)pfVar2 + lVar7) = uVar10;
      lVar7 = lVar7 + 0xc;
    } while (lVar7 != 0x24);
    lVar6 = lVar6 + 1;
    pfVar2 = pfVar2 + 1;
    lVar4 = lVar4 + 0xc;
  } while (lVar6 != 3);
  local_a0 = (TestNode *)this;
  tcu::operator*(&magTransform,&res_1,&local_128);
  this_00 = local_a0;
  local_a8 = 0;
  do {
    uVar1 = init::cases[local_a8].filter;
    local_90 = (ulong)uVar1;
    local_98 = 0x2601;
    if ((uVar1 & 0xfffffffe) == 0x2600) {
      local_98 = (ulong)uVar1;
    }
    bVar8 = init::cases[local_a8].minify != false;
    local_80 = init::cases[local_a8].name;
    local_88 = "_magnify_";
    if (bVar8) {
      local_88 = "_minify_";
    }
    coordTransform = &magTransform;
    if (bVar8) {
      coordTransform = &minTransform;
    }
    lVar4 = 0;
    do {
      internalFormat = *(deUint32 *)((long)&init::texFormats[0].internalFormat + lVar4);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,local_80,&local_129);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_128.m_data.m_data[0].m_data._0_8_ = local_128.m_data.m_data[1].m_data + 1;
      plVar5 = plVar3 + 2;
      if ((float *)*plVar3 == (float *)plVar5) {
        local_128.m_data.m_data[1].m_data._4_8_ = *plVar5;
        local_128.m_data.m_data[2].m_data._0_8_ = plVar3[3];
      }
      else {
        local_128.m_data.m_data[1].m_data._4_8_ = *plVar5;
        local_128.m_data.m_data[0].m_data._0_8_ = (float *)*plVar3;
      }
      local_128.m_data.m_data._8_8_ = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_128);
      res_1.m_data.m_data[0].m_data._0_8_ = res_1.m_data.m_data[1].m_data + 1;
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        res_1.m_data.m_data[1].m_data._4_8_ = *plVar5;
        res_1.m_data.m_data[2].m_data._0_8_ = plVar3[3];
      }
      else {
        res_1.m_data.m_data[1].m_data._4_8_ = *plVar5;
        res_1.m_data.m_data[0].m_data._0_8_ = (long *)*plVar3;
      }
      res_1.m_data.m_data._8_8_ = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((float *)local_128.m_data.m_data[0].m_data._0_8_ != local_128.m_data.m_data[1].m_data + 1)
      {
        operator_delete((void *)local_128.m_data.m_data[0].m_data._0_8_,
                        local_128.m_data.m_data[1].m_data._4_8_ + 1);
      }
      if (local_c8 != local_b8) {
        operator_delete(local_c8,local_b8[0] + 1);
      }
      this_01 = (Texture2DRenderCase *)operator_new(0x218);
      Texture2DRenderCase::Texture2DRenderCase
                (this_01,(Context *)this_00[1]._vptr_TestNode,
                 (char *)res_1.m_data.m_data[0].m_data._0_8_,
                 glcts::fixed_sample_locations_values + 1,internalFormat,0x2901,0x2901,
                 (deUint32)local_90,(deUint32)local_98,coordTransform,1,true);
      tcu::TestNode::addChild(this_00,(TestNode *)this_01);
      if ((float *)res_1.m_data.m_data[0].m_data._0_8_ != res_1.m_data.m_data[1].m_data + 1) {
        operator_delete((void *)res_1.m_data.m_data[0].m_data._0_8_,
                        res_1.m_data.m_data[1].m_data._4_8_ + 1);
      }
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    local_a8 = local_a8 + 1;
  } while (local_a8 != 8);
  return 8;
}

Assistant:

void TextureFilteringTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	internalFormat;
	} texFormats[] =
	{
		{ "rgb565",		GL_RGB565	},
		{ "rgba8",		GL_RGBA8	},
		{ "rg16f",		GL_RG16F	},
		{ "rgba16f",	GL_RGBA16F	}
	};
	static const struct
	{
		const char*	name;
		deUint32	filter;
		bool		minify;
	} cases[] =
	{
		{ "nearest",				GL_NEAREST,					true	},
		{ "nearest",				GL_NEAREST,					false	},
		{ "linear",					GL_LINEAR,					true	},
		{ "linear",					GL_LINEAR,					false	},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST,	true	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR,	true	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST,	true	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR,	true	}
	};

	tcu::Mat3 minTransform	= tcu::translationMatrix(tcu::Vec2(-0.3f, -0.6f)) * tcu::Mat3(tcu::Vec3(1.7f, 2.3f, 1.0f));
	tcu::Mat3 magTransform	= tcu::translationMatrix(tcu::Vec2( 0.3f,  0.4f)) * tcu::Mat3(tcu::Vec3(0.3f, 0.2f, 1.0f));

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
	{
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
		{
			deUint32	format		= texFormats[formatNdx].internalFormat;
			deUint32	minFilter	= cases[caseNdx].filter;
			deUint32	magFilter	= (minFilter == GL_NEAREST || minFilter == GL_LINEAR) ? minFilter : GL_LINEAR;
			deUint32	wrapS		= GL_REPEAT;
			deUint32	wrapT		= GL_REPEAT;
			int			numTextures	= 1;
			bool		minify		= cases[caseNdx].minify;
			string		name		= string(cases[caseNdx].name) + (minify ? "_minify_" : "_magnify_") + texFormats[formatNdx].name;

			addChild(new Texture2DRenderCase(m_context, name.c_str(), "", format, wrapS, wrapT, minFilter, magFilter, minify ? minTransform : magTransform, numTextures, true /* pot */));
		}
	}
}